

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stable-imu-fixed-contact-dynamical-system.cpp
# Opt level: O3

Vector __thiscall
stateObservation::flexibilityEstimation::StableIMUFixedContactDynamicalSystem::measureDynamics
          (StableIMUFixedContactDynamicalSystem *this,Vector *x,Vector *u,TimeIndex k)

{
  Index *this_00;
  double dVar1;
  double dVar2;
  _func_int **pp_Var3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  _func_int *p_Var12;
  bool bVar13;
  char cVar14;
  PointerType ptr;
  long lVar15;
  double *pdVar16;
  _func_int **pp_Var17;
  NoiseBase *pNVar18;
  Index IVar19;
  undefined8 *puVar20;
  ulong uVar21;
  char *__function;
  uint uVar22;
  Index extraout_RDX;
  _func_int **pp_Var23;
  NoiseBase *pNVar24;
  ulong uVar25;
  NoiseBase *pNVar26;
  TimeIndex in_R8;
  ulong uVar27;
  _func_int **__s;
  uint uVar28;
  double dVar29;
  double dVar30;
  double dVar32;
  undefined1 auVar31 [16];
  Vector VVar33;
  Vector *y;
  Matrix3 res;
  Vector3 angularVelocityControl;
  Vector3 positionFlex;
  Vector3 accelerationControl;
  Vector3 velocityControl;
  Vector3 positionControl;
  Vector3 orientationFlexV;
  Vector3 accelerationFlex;
  Vector v;
  Vector3 orientationControlV;
  Quaternion qControl;
  Quaternion qFlex;
  undefined1 local_4e8 [44];
  undefined4 uStack_4bc;
  double dStack_4b8;
  double local_4b0;
  double local_4a8 [6];
  undefined8 local_478;
  double local_470;
  double dStack_468;
  double local_460;
  undefined8 local_458;
  double local_448;
  double dStack_440;
  double local_438;
  Matrix<double,_3,_3,_0,_3,_3> local_428;
  double dStack_3e0;
  double local_3d8;
  double dStack_3d0;
  double local_3c8;
  double dStack_3c0;
  undefined4 local_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 local_3a8;
  undefined4 uStack_3a4;
  undefined4 uStack_3a0;
  undefined4 uStack_39c;
  double local_398;
  double dStack_390;
  double local_388;
  double dStack_380;
  double local_378;
  double dStack_370;
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  double local_348;
  double dStack_340;
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  double local_318;
  double dStack_310;
  double local_308;
  double dStack_300;
  double local_2f8;
  Matrix<double,_3,_1,_0,_3,_1> local_2e8;
  Matrix<double,_3,_1,_0,_3,_1> local_2c8;
  Vector3 local_2a8;
  double local_288;
  double dStack_280;
  double local_278;
  undefined1 local_268 [24];
  undefined1 local_250 [8];
  double *pdStack_248;
  double local_240;
  Matrix<double,_3,_3,_0,_3,_3> *local_238;
  Matrix<double,_3,_1,_0,_3,_1> *local_230;
  Index local_218;
  Matrix<double,_3,_3,_0,_3,_3> *local_210;
  Matrix<double,_3,_3,_0,_3,_3> *local_200;
  Matrix<double,_3,_1,_0,_3,_1> *local_1f8;
  double *local_1e8;
  Matrix<double,_3,_3,_0,_3,_3> *local_1d8;
  double *local_1d0;
  undefined8 local_1c0;
  double local_1b8;
  double local_1b0;
  double dStack_1a8;
  undefined8 local_1a0;
  double local_198;
  double dStack_190;
  double local_188;
  undefined8 local_180;
  undefined1 local_178 [16];
  double *local_168;
  double *local_148;
  double *local_128;
  Vector3 local_118;
  double local_100 [9];
  Quaternion local_b8;
  Quaternion local_98;
  Matrix<double,_3,_3,_0,_3,_3> local_78;
  
  cVar14 = (*(code *)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_data[8])(x,u);
  if (cVar14 == '\0') {
    __assert_fail("checkStateVector(v) && \"ERROR: The state vector has the wrong size\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/dynamical-system/dynamical-system-functor-base.hpp"
                  ,0x40,
                  "void stateObservation::DynamicalSystemFunctorBase::assertStateVector_(const Vector &)"
                 );
  }
  lVar15 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (2 < lVar15) {
    pdVar16 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    uVar21 = lVar15 - 3;
    local_428.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
         = *pdVar16;
    local_428.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
         = pdVar16[1];
    local_428.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
         = pdVar16[2];
    if ((5 < uVar21) && (0xb < uVar21)) {
      local_288 = pdVar16[0xc];
      dStack_280 = pdVar16[0xd];
      local_278 = pdVar16[0xe];
      local_2a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = pdVar16[3];
      local_2a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = pdVar16[4];
      local_2a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = pdVar16[5];
      if (0xe < uVar21) {
        dVar10 = pdVar16[9];
        dVar9 = pdVar16[10];
        dVar1 = pdVar16[0xb];
        dVar4 = pdVar16[0xf];
        dVar11 = pdVar16[0x10];
        dVar2 = pdVar16[0x11];
        computeQuaternion_(&local_98,(StableIMUFixedContactDynamicalSystem *)x,&local_2a8);
        dVar8 = local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array[0] *
                (local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                 m_storage.m_data.array[0] +
                local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array[0]);
        dVar30 = (local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                  m_storage.m_data.array[0] +
                 local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                 m_storage.m_data.array[0]) *
                 local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                 m_storage.m_data.array[3];
        dVar29 = local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                 m_storage.m_data.array[1] +
                 local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                 m_storage.m_data.array[1];
        dVar32 = local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                 m_storage.m_data.array[2] +
                 local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                 m_storage.m_data.array[2];
        local_4e8._0_8_ =
             1.0 - (local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                    m_storage.m_data.array[1] * dVar29 +
                   local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                   m_storage.m_data.array[2] * dVar32);
        local_4b0 = dVar32 * local_98.m_coeffs.
                             super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                             m_data.array[1] - dVar30;
        local_4e8._24_8_ =
             local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
             m_storage.m_data.array[0] * dVar29 -
             dVar32 * local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
                      .m_storage.m_data.array[3];
        local_4e8._32_8_ =
             1.0 - (local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                    m_storage.m_data.array[2] * dVar32 + dVar8);
        local_4e8._8_8_ =
             local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
             m_storage.m_data.array[0] * dVar29 +
             dVar32 * local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
                      .m_storage.m_data.array[3];
        local_4e8._16_8_ =
             local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
             m_storage.m_data.array[0] * dVar32 -
             dVar29 * local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
                      .m_storage.m_data.array[3];
        dVar5 = dVar29 * local_98.m_coeffs.
                         super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array[3] +
                local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array[0] * dVar32;
        unique0x100003ed = SUB84(dVar5,0);
        unique0x100003e5 =
             dVar30 + dVar32 * local_98.m_coeffs.
                               super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                               m_storage.m_data.array[1];
        unique0x100003f1 = (int)((ulong)dVar5 >> 0x20);
        local_4a8[0] = 1.0 - (local_98.m_coeffs.
                              super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                              .m_data.array[1] * dVar29 + dVar8);
        cVar14 = (*(code *)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                           m_storage.m_data[9])(x,k);
        if (cVar14 == '\0') {
          __assert_fail("checkInputvector(v) && \"ERROR: The input vector has the wrong size\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/dynamical-system/dynamical-system-functor-base.hpp"
                        ,0x45,
                        "void stateObservation::DynamicalSystemFunctorBase::assertInputVector_(const Vector &)"
                       );
        }
        if (2 < *(long *)(k + 8)) {
          pdVar16 = *(double **)k;
          uVar21 = *(long *)(k + 8) - 3;
          local_2c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] = *pdVar16;
          local_2c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1] = pdVar16[1];
          local_2c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[2] = pdVar16[2];
          if (5 < uVar21) {
            local_2e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[0] = pdVar16[6];
            local_2e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[1] = pdVar16[7];
            local_2e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2] = pdVar16[8];
            if (0xb < uVar21) {
              local_308 = pdVar16[0xc];
              dStack_300 = pdVar16[0xd];
              local_2f8 = pdVar16[0xe];
              local_118.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0] = pdVar16[3];
              local_118.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[1] = pdVar16[4];
              local_118.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[2] = pdVar16[5];
              local_448 = pdVar16[9];
              dStack_440 = pdVar16[10];
              local_438 = pdVar16[0xb];
              computeQuaternion_(&local_b8,(StableIMUFixedContactDynamicalSystem *)x,&local_118);
              local_318 = local_98.m_coeffs.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                          m_data.array[1] *
                          local_b8.m_coeffs.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                          m_data.array[2];
              dStack_310 = local_98.m_coeffs.
                           super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[1] *
                           local_b8.m_coeffs.
                           super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[3];
              dVar30 = local_98.m_coeffs.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
                       .array[2] *
                       local_b8.m_coeffs.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
                       .array[0] -
                       local_98.m_coeffs.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
                       .array[0] *
                       local_b8.m_coeffs.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
                       .array[2];
              auVar31._8_4_ = SUB84(dVar30,0);
              auVar31._0_8_ =
                   local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                   m_storage.m_data.array[2] *
                   local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                   m_storage.m_data.array[1] -
                   local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                   m_storage.m_data.array[0] *
                   local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                   m_storage.m_data.array[3];
              auVar31._12_4_ = (int)((ulong)dVar30 >> 0x20);
              local_328 = auVar31 ^ _DAT_001987c0;
              local_1c0 = 0;
              local_1b8 = dVar2;
              local_1b0 = -dVar11;
              dStack_1a8 = -dVar2;
              local_1a0 = 0;
              local_198 = dVar4;
              dStack_190 = dVar11;
              local_188 = -dVar4;
              local_180 = 0;
              local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[3] = -dVar1;
              local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[2] = -dVar9;
              local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[7] = -dVar10;
              local_4a8[2] = 0.0;
              local_4a8[3] = dVar1;
              local_4a8[4] = local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                             m_storage.m_data.array[2];
              local_4a8[5] = local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                             m_storage.m_data.array[3];
              local_478 = 0;
              local_470 = dVar10;
              dStack_468 = dVar9;
              local_460 = local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array[7];
              local_458 = 0;
              lVar15 = 0x10;
              do {
                dVar2 = *(double *)((long)local_4a8 + lVar15 + 0x10);
                dVar30 = *(double *)((long)local_4a8 + lVar15);
                dVar5 = *(double *)((long)local_4a8 + lVar15 + 8);
                *(double *)
                 ((long)local_118.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data.array + lVar15 + 8) =
                     dVar5 * local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                             m_storage.m_data.array[3] + dVar30 * 0.0 + dVar2 * dVar9;
                *(double *)((long)local_100 + lVar15 + -8) =
                     dVar5 * 0.0 + dVar30 * dVar1 +
                     dVar2 * local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                             m_storage.m_data.array[7];
                *(double *)((long)local_100 + lVar15) =
                     (dVar2 * 0.0 + dVar5 * dVar10) - dVar30 * dVar9;
                lVar15 = lVar15 + 0x18;
              } while (lVar15 != 0x58);
              local_210 = &local_78;
              local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[0] = 0.0;
              local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[4] = 0.0;
              local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[8] = 0.0;
              pdStack_248 = local_100;
              local_250 = (undefined1  [8])&local_1c0;
              local_238 = (Matrix<double,_3,_3,_0,_3,_3> *)local_4e8;
              local_230 = &local_2c8;
              local_218 = 0x4000000000000000;
              local_1f8 = &local_2e8;
              local_1e8 = &local_288;
              local_1d0 = &local_308;
              local_200 = local_238;
              local_1d8 = local_238;
              local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[1] = dVar1;
              local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[5] = dVar10;
              local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[6] = dVar9;
              Eigen::internal::
              binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
              ::Data::Data((Data *)(local_178 + 8),(XprType *)(local_268 + 0x10));
              local_128 = local_1e8;
              local_348 = *local_168;
              dStack_340 = local_168[1];
              local_3d8 = *local_148;
              dStack_3d0 = local_148[1];
              dVar2 = local_168[2];
              dVar30 = local_148[2];
              local_428.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[8] = *local_1e8;
              dStack_3e0 = local_1e8[1];
              dVar5 = local_1e8[2];
              local_428.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[6] = *local_1d0;
              local_428.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[7] = local_1d0[1];
              local_398 = local_1d0[1];
              dStack_390 = local_1d0[2];
              local_3c8 = (local_1d8->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[0];
              dStack_3c0 = (local_1d8->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                           .m_storage.m_data.array[1];
              local_388 = (local_1d8->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[3];
              dStack_380 = (local_1d8->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                           .m_storage.m_data.array[4];
              dVar11 = (local_1d8->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data.array[6];
              dVar29 = (local_1d8->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data.array[7];
              dVar4 = (local_1d8->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                      m_storage.m_data.array[2] *
                      local_428.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[6];
              local_3a8 = *(undefined4 *)
                           ((local_1d8->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                            ).m_storage.m_data.array + 5);
              uStack_3a4 = *(undefined4 *)
                            ((long)(local_1d8->
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                   m_storage.m_data.array + 0x2c);
              dVar8 = (local_1d8->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                      m_storage.m_data.array[8];
              uStack_3a0 = SUB84(dVar8,0);
              uStack_39c = (undefined4)((ulong)dVar8 >> 0x20);
              local_358._8_4_ = SUB84(local_448 * (double)local_4e8._8_8_,0);
              local_358._0_8_ = local_448 * (double)local_4e8._0_8_;
              local_358._12_4_ = (int)((ulong)(local_448 * (double)local_4e8._8_8_) >> 0x20);
              local_378 = dStack_440;
              dStack_370 = local_438;
              local_368._8_4_ = SUB84(local_438 * local_4b0,0);
              local_368._0_8_ = local_438 * dStack_4b8;
              local_368._12_4_ = (int)((ulong)(local_438 * local_4b0) >> 0x20);
              local_338._8_4_ = SUB84(dStack_440,0);
              local_338._0_8_ = local_448 * (double)local_4e8._16_8_;
              local_338._12_4_ = (int)((ulong)dStack_440 >> 0x20);
              local_178._0_8_ = (double *)0x0;
              local_178._8_8_ = 0;
              uStack_3b0 = SUB84(local_4a8[0],0);
              uStack_3ac = (undefined4)((ulong)local_4a8[0] >> 0x20);
              local_3b8 = local_4e8._40_4_;
              uStack_3b4 = uStack_4bc;
              local_428.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[4] = (double)local_4e8._24_8_;
              local_428.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5] = (double)local_4e8._32_8_;
              pdVar16 = (double *)malloc(0x50);
              if (((ulong)pdVar16 & 0xf) != 0) {
                __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                              ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                              "void *Eigen::internal::aligned_malloc(std::size_t)");
              }
              if (pdVar16 == (double *)0x0) {
                puVar20 = (undefined8 *)__cxa_allocate_exception(8);
                *puVar20 = operator_delete;
                __cxa_throw(puVar20,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
              }
              dVar9 = dVar9 + (double)local_368._8_8_ +
                              (double)local_358._8_8_ +
                              local_428.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                              .m_storage.m_data.array[5] * local_378;
              *pdVar16 = local_98.m_coeffs.
                         super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array[3] *
                         local_b8.m_coeffs.
                         super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array[0] + local_318 + (double)local_328._0_8_;
              pdVar16[1] = local_98.m_coeffs.
                           super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[3] *
                           local_b8.m_coeffs.
                           super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[1] + dStack_310 + (double)local_328._8_8_;
              pdVar16[2] = local_98.m_coeffs.
                           super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[0] *
                           local_b8.m_coeffs.
                           super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[1] +
                           local_98.m_coeffs.
                           super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[2] *
                           local_b8.m_coeffs.
                           super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[3] +
                           (local_98.m_coeffs.
                            super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                            m_data.array[3] *
                            local_b8.m_coeffs.
                            super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                            m_data.array[2] -
                           local_98.m_coeffs.
                           super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[1] *
                           local_b8.m_coeffs.
                           super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[0]);
              pdVar16[3] = -(local_98.m_coeffs.
                             super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                             m_data.array[0] *
                             local_b8.m_coeffs.
                             super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                             m_data.array[0] +
                            local_98.m_coeffs.
                            super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                            m_data.array[2] *
                            local_b8.m_coeffs.
                            super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                            m_data.array[2]) +
                           (local_98.m_coeffs.
                            super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                            m_data.array[3] *
                            local_b8.m_coeffs.
                            super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                            m_data.array[3] -
                           local_98.m_coeffs.
                           super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[1] *
                           local_b8.m_coeffs.
                           super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[1]);
              pdVar16[4] = dVar11 * dStack_390 +
                           local_388 * local_398 +
                           local_3c8 *
                           local_428.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[6] +
                           local_348 + local_3d8 +
                           local_428.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[8];
              pdVar16[5] = dVar29 * dStack_390 +
                           dStack_380 * local_398 +
                           dStack_3c0 *
                           local_428.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[6] + dStack_340 + dStack_3d0 + dStack_3e0;
              pdVar16[6] = dVar2 + dVar30 + dVar5 +
                           dVar4 + (double)CONCAT44(uStack_39c,uStack_3a0) * dStack_390 +
                                   (double)CONCAT44(uStack_3a4,local_3a8) * local_398;
              auVar6._8_4_ = SUB84(dVar9,0);
              auVar6._0_8_ = dVar10 + (double)local_368._0_8_ +
                                      (double)local_358._0_8_ +
                                      local_428.
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                      m_storage.m_data.array[4] * local_378;
              auVar6._12_4_ = (int)((ulong)dVar9 >> 0x20);
              *(undefined1 (*) [16])(pdVar16 + 7) = auVar6;
              pdVar16[9] = dVar1 + (double)local_338._0_8_ +
                                   (double)CONCAT44(uStack_3ac,uStack_3b0) * dStack_370 +
                                   (double)CONCAT44(uStack_3b4,local_3b8) * local_378;
              local_178._8_8_ = 10;
              this_00 = &(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_rows;
              local_178._0_8_ = pdVar16;
              AlgebraicSensor::setState((AlgebraicSensor *)this_00,(Vector *)local_178,in_R8);
              pp_Var3 = (_func_int **)
                        x[0x16].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_rows;
              if ((long)pp_Var3 < 0) {
                __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                              ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                              "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
                             );
              }
              (this->super_DynamicalSystemFunctorBase)._vptr_DynamicalSystemFunctorBase =
                   (_func_int **)0x0;
              (this->sensor_).super_AlgebraicSensor.super_SensorBase._vptr_SensorBase =
                   (_func_int **)0x0;
              if (pp_Var3 == (_func_int **)0x0) {
                pp_Var23 = (_func_int **)0x0;
                __s = (_func_int **)0x0;
              }
              else {
                Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                          ((DenseStorage<double,__1,__1,_1,_0> *)this,(Index)pp_Var3,(Index)pp_Var3,
                           1);
                if ((this->sensor_).super_AlgebraicSensor.super_SensorBase._vptr_SensorBase !=
                    pp_Var3) {
                  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>, T1 = double, T2 = double]"
                               );
                }
                __s = (this->super_DynamicalSystemFunctorBase)._vptr_DynamicalSystemFunctorBase;
                if (pp_Var3 == (_func_int **)0x1) {
                  pp_Var23 = (_func_int **)0x0;
                }
                else {
                  pp_Var23 = (_func_int **)((ulong)pp_Var3 & 0x7ffffffffffffffe);
                  pp_Var17 = (_func_int **)0x2;
                  if ((_func_int **)0x2 < pp_Var23) {
                    pp_Var17 = pp_Var23;
                  }
                  memset(__s,0,(long)pp_Var17 * 8);
                }
              }
              if (pp_Var23 <= pp_Var3 && (long)pp_Var3 - (long)pp_Var23 != 0) {
                memset(__s + (long)pp_Var23,0,((long)pp_Var3 - (long)pp_Var23) * 8);
              }
              AlgebraicSensor::getMeasurements((AlgebraicSensor *)local_268,SUB81(this_00,0));
              pNVar18 = (NoiseBase *)AlgebraicSensor::getMeasurementSize((AlgebraicSensor *)this_00)
              ;
              pp_Var3 = (this->super_DynamicalSystemFunctorBase)._vptr_DynamicalSystemFunctorBase;
              if ((long)pNVar18 < 0 && pp_Var3 != (_func_int **)0x0) {
                __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                              ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                              "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
                             );
              }
              if ((-1 < (long)pNVar18) &&
                 ((long)pNVar18 <=
                  (long)(this->sensor_).super_AlgebraicSensor.super_SensorBase._vptr_SensorBase)) {
                if (pNVar18 != (NoiseBase *)local_268._8_8_) {
                  __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                                ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                                "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>]"
                               );
                }
                pNVar24 = pNVar18;
                if ((((ulong)pp_Var3 & 7) == 0) &&
                   (pNVar24 = (NoiseBase *)(ulong)((uint)((ulong)pp_Var3 >> 3) & 1),
                   pNVar18 <= pNVar24)) {
                  pNVar24 = pNVar18;
                }
                lVar15 = (long)pNVar18 - (long)pNVar24;
                if (pNVar24 != (NoiseBase *)0x0) {
                  pNVar26 = (NoiseBase *)0x0;
                  do {
                    pp_Var3[(long)pNVar26] = *(_func_int **)(local_268._0_8_ + pNVar26 * 8);
                    pNVar26 = (NoiseBase *)((long)&pNVar26->_vptr_NoiseBase + 1);
                  } while (pNVar24 != pNVar26);
                }
                pNVar26 = (NoiseBase *)
                          ((long)&pNVar24->_vptr_NoiseBase +
                          (lVar15 - (lVar15 >> 0x3f) & 0xfffffffffffffffeU));
                if (1 < lVar15) {
                  do {
                    p_Var12 = ((_func_int **)(local_268._0_8_ + pNVar24 * 8))[1];
                    pp_Var3[(long)pNVar24] = *(_func_int **)(local_268._0_8_ + pNVar24 * 8);
                    (pp_Var3 + (long)pNVar24)[1] = p_Var12;
                    pNVar24 = (NoiseBase *)((long)&pNVar24->_vptr_NoiseBase + 2);
                  } while ((long)pNVar24 < (long)pNVar26);
                }
                if ((long)pNVar26 < (long)pNVar18) {
                  do {
                    pp_Var3[(long)pNVar26] = *(_func_int **)(local_268._0_8_ + pNVar26 * 8);
                    pNVar26 = (NoiseBase *)((long)&pNVar26->_vptr_NoiseBase + 1);
                  } while (pNVar18 != pNVar26);
                }
                free((void *)local_268._0_8_);
                pdVar16 = x[0x17].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_data;
                if ((double *)
                    x[0x17].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                    .m_rows != pdVar16) {
                  uVar28 = 0;
                  uVar21 = 0;
                  do {
                    IVar19 = AlgebraicSensor::getMeasurementSize((AlgebraicSensor *)this_00);
                    lVar15 = (ulong)(uint)((int)uVar21 * 3) + IVar19;
                    if ((lVar15 < 0) ||
                       ((long)(this->sensor_).super_AlgebraicSensor.super_SensorBase.
                              _vptr_SensorBase + -3 < lVar15)) goto LAB_001576c0;
                    local_230 = (Matrix<double,_3,_1,_0,_3,_1> *)(pdVar16 + uVar21 * 3);
                    pp_Var3 = (this->super_DynamicalSystemFunctorBase).
                              _vptr_DynamicalSystemFunctorBase;
                    local_268._16_8_ = local_250;
                    dVar2 = (local_230->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                            ).m_storage.m_data.array[0];
                    dVar30 = (local_230->
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
                             .m_data.array[1];
                    dVar5 = (local_230->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                            ).m_storage.m_data.array[2];
                    dVar1 = dVar5 * local_4b0 +
                            dVar30 * (double)local_4e8._32_8_ + dVar2 * (double)local_4e8._8_8_;
                    unique0x10000c81 = SUB84(dVar1,0);
                    local_250 = (undefined1  [8])
                                (dVar5 * dStack_4b8 +
                                dVar30 * (double)local_4e8._24_8_ + dVar2 * (double)local_4e8._0_8_)
                    ;
                    unique0x10000c85 = (int)((ulong)dVar1 >> 0x20);
                    local_240 = local_4a8[0] *
                                (local_230->
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                m_storage.m_data.array[2] +
                                stack0xfffffffffffffb40 *
                                (local_230->
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                m_storage.m_data.array[1] +
                                (double)local_4e8._16_8_ *
                                (local_230->
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                m_storage.m_data.array[0];
                    local_238 = &local_428;
                    if (((ulong)(pp_Var3 + lVar15) & 7) == 0) {
                      uVar25 = (ulong)(pp_Var3 + lVar15) >> 3;
                      if ((uVar25 & 1) != 0) {
                        uVar22 = (uint)uVar25 & 1 ^ 3;
                        uVar25 = 1;
                        goto LAB_00157596;
                      }
                      uVar27 = 2;
                      bVar13 = true;
                      uVar25 = 0;
LAB_001575e8:
                      lVar15 = IVar19 + (ulong)uVar28;
                      do {
                        pdVar16 = (local_230->
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                  m_storage.m_data.array + uVar25;
                        dVar1 = (local_428.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array[uVar25 + 1] +
                                *(double *)(local_250 + uVar25 * 8 + 8)) - pdVar16[1];
                        auVar7._8_4_ = SUB84(dVar1,0);
                        auVar7._0_8_ = (local_428.
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                        .m_storage.m_data.array[uVar25] +
                                       *(double *)(local_250 + uVar25 * 8)) - *pdVar16;
                        auVar7._12_4_ = (int)((ulong)dVar1 >> 0x20);
                        *(undefined1 (*) [16])(pp_Var3 + lVar15 + uVar25) = auVar7;
                        uVar25 = uVar25 + 2;
                      } while (uVar25 < uVar27);
                      if (bVar13) {
                        do {
                          pp_Var3[lVar15 + uVar27] =
                               (_func_int *)
                               ((*(double *)(local_250 + uVar27 * 8) +
                                local_428.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[uVar27]) -
                               (local_230->
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                               m_storage.m_data.array[uVar27]);
                          uVar27 = uVar27 + 1;
                        } while (uVar27 != 3);
                      }
                    }
                    else {
                      uVar25 = 3;
                      uVar22 = 0;
LAB_00157596:
                      uVar27 = 0;
                      do {
                        pp_Var3[IVar19 + (ulong)uVar28 + uVar27] =
                             (_func_int *)
                             ((*(double *)(local_250 + uVar27 * 8) +
                              local_428.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                              .m_storage.m_data.array[uVar27]) - pdVar16[uVar21 * 3 + uVar27]);
                        uVar27 = uVar27 + 1;
                      } while (uVar25 != uVar27);
                      if (1 < uVar22) {
                        uVar27 = 3;
                        bVar13 = false;
                        goto LAB_001575e8;
                      }
                    }
                    uVar21 = (ulong)((int)uVar21 + 1);
                    pdVar16 = x[0x17].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                              .m_storage.m_data;
                    uVar25 = (x[0x17].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                              .m_storage.m_rows - (long)pdVar16 >> 3) * -0x5555555555555555;
                    uVar28 = uVar28 + 3;
                  } while (uVar21 <= uVar25 && uVar25 - uVar21 != 0);
                }
                free((void *)local_178._0_8_);
                VVar33.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows = extraout_RDX;
                VVar33.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data = (double *)this;
                return (Vector)VVar33.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                               .m_storage;
              }
LAB_001576c0:
              __function = 
              "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
              ;
              goto LAB_001576ec;
            }
          }
        }
      }
    }
  }
  __function = 
  "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
  ;
LAB_001576ec:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

Vector StableIMUFixedContactDynamicalSystem::measureDynamics(const Vector & x, const Vector & u, TimeIndex k)
{
  assertStateVector_(x);

  Vector3 positionFlex(x.segment(indexes::pos, 3));
  Vector3 velocityFlex(x.segment(indexes::linVel, 3));
  Vector3 accelerationFlex(x.segment(indexes::linAcc, 3));

  Vector3 orientationFlexV(x.segment(indexes::ori, 3));
  Vector3 angularVelocityFlex(x.segment(indexes::angVel, 3));
  Vector3 angularAccelerationFlex(x.segment(indexes::angAcc, 3));

  Quaternion qFlex(computeQuaternion_(orientationFlexV));
  Matrix3 rFlex(qFlex.toRotationMatrix());

  assertInputVector_(u);

  Vector3 positionControl(u.segment(indexes::pos, 3));
  Vector3 velocityControl(u.segment(indexes::linVel, 3));
  Vector3 accelerationControl(u.segment(indexes::linAcc, 3));

  Vector3 orientationControlV(u.segment(indexes::ori, 3));
  Vector3 angularVelocityControl(u.segment(indexes::angVel, 3));

  Quaternion qControl(computeQuaternion_(orientationControlV));

  Quaternion q = qFlex * qControl;

  Vector3 acceleration(
      (kine::skewSymmetric(angularAccelerationFlex) + tools::square(kine::skewSymmetric(angularVelocityFlex))) * rFlex
          * positionControl
      + 2 * kine::skewSymmetric(angularVelocityFlex) * rFlex * velocityControl + accelerationFlex
      + rFlex * accelerationControl);

  Vector3 angularVelocity(angularVelocityFlex + rFlex * angularVelocityControl);

  Vector v(Vector::Zero(10, 1));

  v.head<4>() = q.coeffs();

  v.segment(4, 3) = acceleration;
  v.tail(3) = angularVelocity;

  sensor_.setState(v, k);

  Vector y(Matrix::Zero(measurementSize_, 1));

  y.head(sensor_.getMeasurementSize()) = sensor_.getMeasurements();

  for(unsigned i = 0; i < contactPositions_.size(); ++i)
  {
    y.segment(sensor_.getMeasurementSize() + i * 3, 3) =
        rFlex * contactPositions_[i] + positionFlex - contactPositions_[i];
  }

  return y;
}